

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Light.cpp
# Opt level: O3

void __thiscall OpenMD::Perturbations::Light::modifyForces(Light *this)

{
  double *pdVar1;
  undefined8 *puVar2;
  uint uVar3;
  AtomType *pAVar4;
  Snapshot *pSVar5;
  pointer pcVar6;
  DataStoragePointer DVar7;
  bool bVar8;
  uint i_3;
  Molecule *pMVar9;
  pointer ppAVar10;
  RotMat3x3d *pRVar11;
  double (*padVar12) [3];
  uint i_1;
  long lVar13;
  ulong uVar14;
  uint j;
  long lVar15;
  ulong uVar16;
  uint i_5;
  long lVar17;
  SquareMatrix3<double> *pSVar18;
  Atom *pAVar19;
  byte bVar20;
  double tmp;
  undefined4 uVar21;
  undefined4 uVar22;
  RealType RVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  Vector3<double> result_1;
  Vector<double,_3U> result;
  FluctuatingChargeAdapter fqa;
  Vector3d av;
  Vector3d D;
  Vector3d f;
  MoleculeIterator i;
  Vector3d J;
  Vector3<double> result_2;
  Vector3d EFk;
  MultipoleAdapter ma;
  FixedChargeAdapter fca;
  Vector3d trq;
  Mat3x3d I;
  undefined1 local_328 [16];
  double local_318;
  double local_310;
  undefined1 local_308 [16];
  potVec local_2f8;
  FluctuatingChargeAdapter local_2b0;
  double local_2a8;
  undefined8 uStack_2a0;
  double local_298 [4];
  double local_278 [4];
  double local_258 [3];
  MoleculeIterator local_240;
  double local_238 [4];
  double local_218 [4];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  double local_1d8;
  double local_1c8 [4];
  RealType local_1a8;
  RotMat3x3d *local_1a0;
  RotMat3x3d *local_198;
  RealType local_190;
  Molecule *local_188;
  pointer local_180;
  MultipoleAdapter local_178;
  FixedChargeAdapter local_170;
  double local_168 [4];
  double local_148 [4];
  double local_128;
  undefined8 uStack_120;
  double local_118;
  double dStack_110;
  double local_108;
  double dStack_100;
  double local_f8;
  undefined8 uStack_f0;
  double local_e8;
  double dStack_e0;
  double local_d8;
  double dStack_d0;
  double local_c8;
  double dStack_c0;
  SquareMatrix3<double> local_b8;
  potVec local_68;
  
  bVar20 = 0;
  if (this->initialized == false) {
    initialize(this);
  }
  local_240._M_node = (_Base_ptr)0x0;
  local_c8 = 0.0;
  dStack_c0 = 0.0;
  local_e8 = 0.0;
  dStack_e0 = 0.0;
  local_d8 = 0.0;
  dStack_d0 = 0.0;
  local_258[2] = 0.0;
  local_258[0] = 0.0;
  local_258[1] = 0.0;
  local_168[2] = 0.0;
  local_168[0] = 0.0;
  local_168[1] = 0.0;
  local_278[2] = 0.0;
  local_278[0] = 0.0;
  local_278[1] = 0.0;
  local_218[2] = 0.0;
  local_218[0] = 0.0;
  local_218[1] = 0.0;
  local_298[2] = 0.0;
  local_298[0] = 0.0;
  local_298[1] = 0.0;
  local_1c8[2] = 0.0;
  local_1c8[0] = 0.0;
  local_1c8[1] = 0.0;
  local_b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] = 0.0;
  local_b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0] = 0.0;
  local_b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][1] = 0.0;
  local_b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] = 0.0;
  local_b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2] = 0.0;
  local_b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] = 0.0;
  local_b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0] = 0.0;
  local_b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0;
  local_b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] = 0.0;
  if (this->doLight == true) {
    local_190 = Snapshot::getTime(this->info_->sman_->currentSnapshot_);
    pMVar9 = SimInfo::beginMolecule(this->info_,&local_240);
    if (pMVar9 == (Molecule *)0x0) {
      local_310 = 0.0;
    }
    else {
      local_198 = &this->A_;
      local_1a0 = &this->Ainv_;
      local_310 = 0.0;
      do {
        ppAVar10 = (pMVar9->atoms_).
                   super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        if ((ppAVar10 !=
             (pMVar9->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
             _M_impl.super__Vector_impl_data._M_finish) &&
           (pAVar19 = *ppAVar10, pAVar19 != (Atom *)0x0)) {
          local_188 = pMVar9;
          do {
            local_180 = ppAVar10;
            pAVar4 = pAVar19->atomType_;
            pSVar5 = ((pAVar19->super_StuntDouble).snapshotMan_)->currentSnapshot_;
            lVar13 = *(long *)((long)&(pSVar5->atomData).position.
                                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start +
                              (pAVar19->super_StuntDouble).storage_);
            lVar15 = (long)(pAVar19->super_StuntDouble).localIndex_ * 0x18;
            local_148[2] = (double)*(undefined8 *)(lVar13 + 0x10 + lVar15);
            pdVar1 = (double *)(lVar13 + lVar15);
            local_148[0] = *pdVar1;
            local_148[1] = pdVar1[1];
            lVar13 = *(long *)((long)&(pSVar5->atomData).velocity.
                                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start +
                              (pAVar19->super_StuntDouble).storage_);
            pdVar1 = (double *)(lVar13 + lVar15);
            local_118 = *pdVar1;
            dStack_110 = pdVar1[1];
            local_128 = *(double *)(lVar13 + 0x10 + lVar15);
            uStack_120 = 0;
            local_2f8.data_[0] = 0.0;
            local_2f8.data_[1] = 0.0;
            local_2f8.data_[2] = 0.0;
            lVar13 = 0;
            pRVar11 = local_198;
            do {
              dVar24 = local_2f8.data_[lVar13];
              lVar15 = 0;
              do {
                dVar24 = dVar24 + (pRVar11->super_SquareMatrix<double,_3>).
                                  super_RectMatrix<double,_3U,_3U>.data_[0][lVar15] *
                                  local_148[lVar15];
                lVar15 = lVar15 + 1;
              } while (lVar15 != 3);
              local_2f8.data_[lVar13] = dVar24;
              lVar13 = lVar13 + 1;
              pRVar11 = (RotMat3x3d *)
                        ((pRVar11->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                         data_ + 1);
            } while (lVar13 != 3);
            dVar24 = local_2f8.data_[2] * this->kmag_ - this->omega_ * local_190;
            pcVar6 = (this->jones_).
                     super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            dVar25 = this->E0_ * *(double *)(pcVar6->_M_value + 8);
            local_308._8_4_ = SUB84(dVar25,0);
            local_308._0_8_ = this->E0_ * *(double *)pcVar6->_M_value;
            local_308._12_4_ = (int)((ulong)dVar25 >> 0x20);
            local_2a8 = dVar24;
            local_328._0_8_ = cexp(0.0);
            local_2f8.data_[0] = (double)local_308._0_8_;
            local_2f8.data_[1] = (double)local_308._8_8_;
            local_328._8_8_ = dVar24;
            std::complex<double>::operator*=
                      ((complex<double> *)local_2f8.data_,(complex<double> *)local_328);
            local_308._0_8_ = local_2f8.data_[0];
            pcVar6 = (this->jones_).
                     super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            dVar24 = this->E0_ * *(double *)(pcVar6[1]._M_value + 8);
            local_1f8._8_4_ = SUB84(dVar24,0);
            local_1f8._0_8_ = this->E0_ * *(double *)pcVar6[1]._M_value;
            local_1f8._12_4_ = (int)((ulong)dVar24 >> 0x20);
            uVar21 = SUB84(local_2a8,0);
            uVar22 = (undefined4)((ulong)local_2a8 >> 0x20);
            local_328._0_8_ = cexp(0.0);
            local_328._12_4_ = uVar22;
            local_328._8_4_ = uVar21;
            local_2f8.data_[0] = (double)local_1f8._0_8_;
            local_2f8.data_[1] = (double)local_1f8._8_8_;
            std::complex<double>::operator*=
                      ((complex<double> *)local_2f8.data_,(complex<double> *)local_328);
            local_1c8[0] = (double)local_308._0_8_;
            local_1c8[1] = local_2f8.data_[0];
            local_1c8[2] = 0.0;
            local_2f8.data_[2] = 0.0;
            local_2f8.data_[0] = 0.0;
            local_2f8.data_[1] = 0.0;
            lVar13 = 0;
            pRVar11 = local_1a0;
            do {
              dVar24 = local_2f8.data_[lVar13];
              lVar15 = 0;
              do {
                dVar24 = dVar24 + (pRVar11->super_SquareMatrix<double,_3>).
                                  super_RectMatrix<double,_3U,_3U>.data_[0][lVar15] *
                                  local_1c8[lVar15];
                lVar15 = lVar15 + 1;
              } while (lVar15 != 3);
              local_2f8.data_[lVar13] = dVar24;
              lVar13 = lVar13 + 1;
              pRVar11 = (RotMat3x3d *)
                        ((pRVar11->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                         data_ + 1);
            } while (lVar13 != 3);
            local_238[2] = local_2f8.data_[2];
            local_238[0] = local_2f8.data_[0];
            local_238[1] = local_2f8.data_[1];
            dVar24 = (this->khat_).super_Vector<double,_3U>.data_[0];
            dVar26 = (this->khat_).super_Vector<double,_3U>.data_[1];
            dVar27 = (this->khat_).super_Vector<double,_3U>.data_[2];
            local_108 = local_2f8.data_[2];
            dStack_100 = local_2f8.data_[0];
            local_f8 = local_2f8.data_[0];
            uStack_f0 = 0;
            dVar25 = dVar24 * local_2f8.data_[2] - dVar27 * local_2f8.data_[0];
            local_328._8_4_ = SUB84(dVar25,0);
            local_328._0_8_ = dVar27 * local_2f8.data_[1] - dVar26 * local_2f8.data_[2];
            local_328._12_4_ = (int)((ulong)dVar25 >> 0x20);
            local_1f8._8_8_ = local_2f8.data_[2];
            local_1f8._0_8_ = local_2f8.data_[1];
            local_318 = local_2f8.data_[0] * dVar26 - dVar24 * local_2f8.data_[1];
            local_2f8.data_[0] = 0.0;
            local_2f8.data_[1] = 0.0;
            local_2f8.data_[2] = 0.0;
            lVar13 = 0;
            do {
              local_2f8.data_[lVar13] = *(double *)(local_328 + lVar13 * 8) / 2997.9245800000003;
              lVar13 = lVar13 + 1;
            } while (lVar13 != 3);
            local_2a8 = local_2f8.data_[0];
            uStack_2a0 = 0;
            local_308._8_8_ = local_2f8.data_[2];
            local_308._0_8_ = local_2f8.data_[1];
            lVar13 = (long)(pAVar19->super_StuntDouble).localIndex_ * 0x18 +
                     *(long *)((long)&(((pAVar19->super_StuntDouble).snapshotMan_)->currentSnapshot_
                                      ->atomData).electricField.
                                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start +
                              (pAVar19->super_StuntDouble).storage_);
            lVar15 = 0;
            do {
              *(double *)(lVar13 + lVar15 * 8) =
                   local_238[lVar15] + *(double *)(lVar13 + lVar15 * 8);
              lVar15 = lVar15 + 1;
            } while (lVar15 != 3);
            local_170.at_ = pAVar4;
            bVar8 = FixedChargeAdapter::isFixedCharge(&local_170);
            if (bVar8) {
              local_1a8 = FixedChargeAdapter::getCharge(&local_170);
              local_2b0.at_ = pAVar4;
              bVar8 = FluctuatingChargeAdapter::isFluctuatingCharge(&local_2b0);
              dVar24 = local_1a8;
              RVar23 = local_1a8;
              if (bVar8) {
LAB_001c404b:
                DVar7 = (pAVar19->super_StuntDouble).storage_;
                pSVar5 = ((pAVar19->super_StuntDouble).snapshotMan_)->currentSnapshot_;
                lVar13 = (long)(pAVar19->super_StuntDouble).localIndex_;
                dVar24 = *(double *)
                          (*(long *)((long)&(pSVar5->atomData).flucQPos.
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_start + DVar7) +
                          lVar13 * 8);
                dVar25 = 0.0;
                lVar15 = 0;
                do {
                  dVar25 = dVar25 + local_148[lVar15] * local_238[lVar15];
                  lVar15 = lVar15 + 1;
                } while (lVar15 != 3);
                lVar15 = *(long *)((long)&(pSVar5->atomData).flucQFrc.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_start + DVar7);
                *(double *)(lVar15 + lVar13 * 8) = dVar25 + *(double *)(lVar15 + lVar13 * 8);
                dVar24 = RVar23 + dVar24;
              }
              local_1e8._8_8_ = local_2a8 * local_128 - local_118 * (double)local_308._8_8_;
              local_1e8._0_8_ =
                   (double)local_308._8_8_ * dStack_110 - local_128 * (double)local_308._0_8_;
              local_1d8 = local_118 * (double)local_308._0_8_ - dStack_110 * local_2a8;
              local_328 = ZEXT816(0);
              local_318 = 0.0;
              lVar13 = 0;
              do {
                *(double *)(local_328 + lVar13 * 8) =
                     local_238[lVar13] + *(double *)(local_1e8 + lVar13 * 8);
                lVar13 = lVar13 + 1;
              } while (lVar13 != 3);
              local_2f8.data_[0] = 0.0;
              local_2f8.data_[1] = 0.0;
              local_2f8.data_[2] = 0.0;
              lVar13 = 0;
              do {
                local_2f8.data_[lVar13] = *(double *)(local_328 + lVar13 * 8) * dVar24;
                lVar13 = lVar13 + 1;
              } while (lVar13 != 3);
              local_258[2] = local_2f8.data_[2];
              local_258[0] = local_2f8.data_[0];
              local_258[1] = local_2f8.data_[1];
              DVar7 = (pAVar19->super_StuntDouble).storage_;
              pSVar5 = ((pAVar19->super_StuntDouble).snapshotMan_)->currentSnapshot_;
              lVar13 = (long)(pAVar19->super_StuntDouble).localIndex_;
              lVar15 = lVar13 * 0x18 +
                       *(long *)((long)&(pSVar5->atomData).force.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + DVar7);
              lVar17 = 0;
              do {
                *(double *)(lVar15 + lVar17 * 8) =
                     local_258[lVar17] + *(double *)(lVar15 + lVar17 * 8);
                lVar17 = lVar17 + 1;
              } while (lVar17 != 3);
              dVar24 = 0.0;
              lVar15 = 0;
              do {
                dVar24 = dVar24 + local_148[lVar15] * local_258[lVar15];
                lVar15 = lVar15 + 1;
              } while (lVar15 != 3);
              if (this->doParticlePot == true) {
                lVar15 = *(long *)((long)&(pSVar5->atomData).particlePot.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_start + DVar7);
                *(double *)(lVar15 + lVar13 * 8) = *(double *)(lVar15 + lVar13 * 8) - dVar24;
              }
              local_310 = local_310 - dVar24;
            }
            else {
              local_2b0.at_ = pAVar4;
              bVar8 = FluctuatingChargeAdapter::isFluctuatingCharge(&local_2b0);
              RVar23 = 0.0;
              if (bVar8) goto LAB_001c404b;
            }
            local_178.at_ = pAVar4;
            bVar8 = MultipoleAdapter::isDipole(&local_178);
            if (bVar8) {
              lVar15 = (long)(pAVar19->super_StuntDouble).localIndex_;
              lVar13 = *(long *)((long)&(((pAVar19->super_StuntDouble).snapshotMan_)->
                                         currentSnapshot_->atomData).dipole.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                (pAVar19->super_StuntDouble).storage_);
              local_318 = (double)*(undefined8 *)(lVar13 + 0x10 + lVar15 * 0x18);
              puVar2 = (undefined8 *)(lVar13 + lVar15 * 0x18);
              local_328._0_8_ = *puVar2;
              local_328._8_8_ = puVar2[1];
              local_2f8.data_[0] = 0.0;
              local_2f8.data_[1] = 0.0;
              local_2f8.data_[2] = 0.0;
              lVar13 = 0;
              do {
                local_2f8.data_[lVar13] = *(double *)(local_328 + lVar13 * 8) * 0.2081943;
                lVar13 = lVar13 + 1;
              } while (lVar13 != 3);
              local_278[2] = local_2f8.data_[2];
              local_278[0] = local_2f8.data_[0];
              local_278[1] = local_2f8.data_[1];
              local_328._8_8_ =
                   dStack_100 * local_2f8.data_[2] - (double)local_1f8._8_8_ * local_2f8.data_[0];
              local_328._0_8_ =
                   local_108 * local_2f8.data_[1] - (double)local_1f8._0_8_ * local_2f8.data_[2];
              local_318 = (double)local_1f8._0_8_ * local_2f8.data_[0] -
                          local_f8 * local_2f8.data_[1];
              dVar27 = local_128 * local_2a8 - (double)local_308._8_8_ * local_118;
              dVar25 = local_118 * (double)local_308._0_8_ - local_2a8 * dStack_110;
              dVar26 = dStack_110 * (double)local_308._8_8_ - (double)local_308._0_8_ * local_128;
              dVar24 = local_2f8.data_[2] * dVar26 - dVar25 * local_2f8.data_[0];
              local_1e8._8_4_ = SUB84(dVar24,0);
              local_1e8._0_8_ = local_2f8.data_[1] * dVar25 - dVar27 * local_2f8.data_[2];
              local_1e8._12_4_ = (int)((ulong)dVar24 >> 0x20);
              local_1d8 = local_2f8.data_[0] * dVar27 - dVar26 * local_2f8.data_[1];
              local_2f8.data_[0] = 0.0;
              local_2f8.data_[1] = 0.0;
              local_2f8.data_[2] = 0.0;
              lVar13 = 0;
              do {
                local_2f8.data_[lVar13] =
                     *(double *)(local_328 + lVar13 * 8) + *(double *)(local_1e8 + lVar13 * 8);
                lVar13 = lVar13 + 1;
              } while (lVar13 != 3);
              lVar13 = 0;
              do {
                local_168[lVar13] = local_2f8.data_[lVar13] + local_168[lVar13];
                lVar13 = lVar13 + 1;
              } while (lVar13 != 3);
              pSVar5 = ((pAVar19->super_StuntDouble).snapshotMan_)->currentSnapshot_;
              lVar13 = (long)(pAVar19->super_StuntDouble).localIndex_;
              lVar15 = lVar13 * 0x18 +
                       *(long *)((long)&(pSVar5->atomData).torque.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                (pAVar19->super_StuntDouble).storage_);
              lVar17 = 0;
              do {
                *(double *)(lVar15 + lVar17 * 8) =
                     local_168[lVar17] + *(double *)(lVar15 + lVar17 * 8);
                lVar17 = lVar17 + 1;
              } while (lVar17 != 3);
              lVar15 = *(long *)((long)&(pSVar5->atomData).angularMomentum.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                (pAVar19->super_StuntDouble).storage_);
              local_218[2] = *(double *)(lVar15 + 0x10 + lVar13 * 0x18);
              pdVar1 = (double *)(lVar15 + lVar13 * 0x18);
              local_218[0] = *pdVar1;
              local_218[1] = pdVar1[1];
              (*(pAVar19->super_StuntDouble)._vptr_StuntDouble[5])
                        ((double (*) [3])local_2f8.data_,pAVar19);
              padVar12 = (double (*) [3])local_2f8.data_;
              pSVar18 = &local_b8;
              for (lVar13 = 9; lVar13 != 0; lVar13 = lVar13 + -1) {
                (pSVar18->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0]
                [0] = (((SquareMatrix3<double> *)padVar12)->super_SquareMatrix<double,_3>).
                      super_RectMatrix<double,_3U,_3U>.data_[0][0];
                padVar12 = (double (*) [3])((long)padVar12 + ((ulong)bVar20 * -2 + 1) * 8);
                pSVar18 = (SquareMatrix3<double> *)((long)pSVar18 + ((ulong)bVar20 * -2 + 1) * 8);
              }
              if ((pAVar19->super_StuntDouble).linear_ == true) {
                uVar3 = (pAVar19->super_StuntDouble).linearAxis_;
                uVar14 = (ulong)(((int)(uVar3 + 1) / 3) * -3 + uVar3 + 1);
                uVar16 = (ulong)(((int)(uVar3 + 2) / 3) * -3 + uVar3 + 2);
                dVar24 = local_218[uVar14];
                dVar25 = *(double *)
                          ((long)local_b8.super_SquareMatrix<double,_3>.
                                 super_RectMatrix<double,_3U,_3U>.data_ + uVar14 * 0x20);
                local_298[uVar3] = 0.0;
                local_298[uVar14] = dVar24 / dVar25;
                local_298[uVar16] =
                     local_218[uVar16] /
                     *(double *)
                      ((long)local_b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>
                             .data_ + uVar16 * 0x20);
              }
              else {
                SquareMatrix3<double>::inverse((SquareMatrix3<double> *)local_2f8.data_,&local_b8);
                local_328 = ZEXT816(0);
                local_318 = 0.0;
                lVar13 = 0;
                padVar12 = (double (*) [3])local_2f8.data_;
                do {
                  dVar24 = *(double *)(local_328 + lVar13 * 8);
                  lVar15 = 0;
                  do {
                    dVar24 = dVar24 + (((SquareMatrix<double,_3> *)*padVar12)->
                                      super_RectMatrix<double,_3U,_3U>).data_[0][lVar15] *
                                      local_218[lVar15];
                    lVar15 = lVar15 + 1;
                  } while (lVar15 != 3);
                  *(double *)(local_328 + lVar13 * 8) = dVar24;
                  lVar13 = lVar13 + 1;
                  padVar12 = padVar12 + 1;
                } while (lVar13 != 3);
                local_298[2] = local_318;
                local_298[0] = (double)local_328._0_8_;
                local_298[1] = (double)local_328._8_8_;
              }
              dVar26 = local_298[1] * local_278[2] - local_278[1] * local_298[2];
              dVar24 = local_298[2] * local_278[0] - local_278[2] * local_298[0];
              dVar25 = local_298[0] * local_278[1] - local_278[0] * local_298[1];
              local_258[0] = (double)local_308._8_8_ * dVar24 - dVar25 * (double)local_308._0_8_;
              local_258[1] = local_2a8 * dVar25 - dVar26 * (double)local_308._8_8_;
              local_258[2] = dVar26 * (double)local_308._0_8_ - dVar24 * local_2a8;
              DVar7 = (pAVar19->super_StuntDouble).storage_;
              pSVar5 = ((pAVar19->super_StuntDouble).snapshotMan_)->currentSnapshot_;
              lVar13 = (long)(pAVar19->super_StuntDouble).localIndex_;
              lVar15 = lVar13 * 0x18 +
                       *(long *)((long)&(pSVar5->atomData).force.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + DVar7);
              lVar17 = 0;
              do {
                *(double *)(lVar15 + lVar17 * 8) =
                     local_258[lVar17] + *(double *)(lVar15 + lVar17 * 8);
                lVar17 = lVar17 + 1;
              } while (lVar17 != 3);
              dVar24 = 0.0;
              lVar15 = 0;
              do {
                dVar24 = dVar24 + local_278[lVar15] * local_238[lVar15];
                lVar15 = lVar15 + 1;
              } while (lVar15 != 3);
              if (this->doParticlePot == true) {
                lVar15 = *(long *)((long)&(pSVar5->atomData).particlePot.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_start + DVar7);
                *(double *)(lVar15 + lVar13 * 8) = *(double *)(lVar15 + lVar13 * 8) - dVar24;
              }
              local_310 = local_310 - dVar24;
            }
            ppAVar10 = local_180 + 1;
          } while ((ppAVar10 !=
                    (local_188->atoms_).
                    super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                    super__Vector_impl_data._M_finish) &&
                  (pAVar19 = *ppAVar10, pAVar19 != (Atom *)0x0));
        }
        pMVar9 = SimInfo::nextMolecule(this->info_,&local_240);
      } while (pMVar9 != (Molecule *)0x0);
    }
    pSVar5 = this->info_->sman_->currentSnapshot_;
    Snapshot::getLongRangePotentials(&local_2f8,pSVar5);
    local_c8 = local_2f8.data_[0];
    dStack_c0 = local_2f8.data_[1];
    local_d8 = local_2f8.data_[5];
    dStack_d0 = local_2f8.data_[6];
    local_e8 = local_2f8.data_[3];
    dStack_e0 = local_2f8.data_[4];
    local_68.data_[2] = local_310 + local_2f8.data_[2];
    local_68.data_[0] = local_2f8.data_[0];
    local_68.data_[1] = local_2f8.data_[1];
    local_68.data_[3] = local_2f8.data_[3];
    local_68.data_[4] = local_2f8.data_[4];
    local_68.data_[5] = local_2f8.data_[5];
    local_68.data_[6] = local_2f8.data_[6];
    Snapshot::setLongRangePotentials(pSVar5,&local_68);
  }
  return;
}

Assistant:

void Light::modifyForces() {
    if (!initialized) initialize();

    SimInfo::MoleculeIterator i;
    Molecule::AtomIterator j;
    Molecule* mol;
    Atom* atom;
    AtomType* atype;
    potVec longRangePotential(0.0);
    int l, m, n;
    RealType C {}, U {}, fPot {};
    Vector3d r {}, rp {}, v {}, f {}, trq {}, D {}, J {}, av {};
    Vector3d EFk {}, EF {}, BF {};
    Mat3x3d I {};

    bool isCharge;

    if (doLight) {
      RealType t = info_->getSnapshotManager()->getCurrentSnapshot()->getTime();
      U          = 0.0;
      fPot       = 0.0;

      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        for (atom = mol->beginAtom(j); atom != NULL; atom = mol->nextAtom(j)) {
          isCharge = false;
          C        = 0.0;

          atype = atom->getAtomType();

          // We are not wrapping coordinates for light interactions:
          r = atom->getPos();
          v = atom->getVel();

          rp = A_ * r;  // atom's position in frame of light propagation

          // e^{ i (k*z - omega * t) } is the main oscillatory component:
          std::complex<RealType> argument(0.0, kmag_ * rp.z() - omega_ * t);
          std::complex<RealType> Ex = E0_ * jones_[0] * std::exp(argument);
          std::complex<RealType> Ey = E0_ * jones_[1] * std::exp(argument);

          EFk.x() = Ex.real();
          EFk.y() = Ey.real();
          EFk.z() = 0.0;

          EF = Ainv_ * EFk;  // electric field rotated back into lab coordinates

          // The magnetic field (BF) is perpendicular to both electric field
          // and light propagation direction:

          BF = cross(EF, khat_) / Constants::c;

          atom->addElectricField(EF);

          FixedChargeAdapter fca = FixedChargeAdapter(atype);
          if (fca.isFixedCharge()) {
            isCharge = true;
            C        = fca.getCharge();
          }

          FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter(atype);
          if (fqa.isFluctuatingCharge()) {
            isCharge = true;
            C += atom->getFlucQPos();
            atom->addFlucQFrc(dot(r, EF));
          }

          if (isCharge) {
            f = C * (EF + cross(v, BF));
            atom->addFrc(f);
            U = -dot(r, f);
            if (doParticlePot) { atom->addParticlePot(U); }
            fPot += U;
          }

          MultipoleAdapter ma = MultipoleAdapter(atype);
          if (ma.isDipole()) {
            D = atom->getDipole() * Constants::dipoleConvert;

            trq += cross(D, EF) + cross(D, cross(v, BF));

            atom->addTrq(trq);

            J = atom->getJ();
            I = atom->getI();
            if (atom->isLinear()) {
              l     = atom->linearAxis();
              m     = (l + 1) % 3;
              n     = (l + 2) % 3;
              av[l] = 0;
              av[m] = J[m] / I(m, m);
              av[n] = J[n] / I(n, n);
            } else {
              av = I.inverse() * J;
            }

            f = cross(cross(av, D), BF);
            atom->addFrc(f);

            U = -dot(D, EF);
            if (doParticlePot) { atom->addParticlePot(U); }
            fPot += U;
          }
        }
      }

#ifdef IS_MPI
      MPI_Allreduce(MPI_IN_PLACE, &fPot, 1, MPI_REALTYPE, MPI_SUM,
                    MPI_COMM_WORLD);
#endif

      Snapshot* snap     = info_->getSnapshotManager()->getCurrentSnapshot();
      longRangePotential = snap->getLongRangePotentials();
      longRangePotential[ELECTROSTATIC_FAMILY] += fPot;
      snap->setLongRangePotentials(longRangePotential);
    }
  }